

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O0

void __thiscall
tchecker::
make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>
::release_reference(make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>
                    *this)

{
  refcount_t *prVar1;
  underflow_error *this_00;
  refcount_t *refcount;
  make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>
  *this_local;
  
  prVar1 = refcount_addr(this);
  if (*prVar1 == 0) {
    this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
    std::underflow_error::underflow_error(this_00,"reference counter underflow");
    __cxa_throw(this_00,&std::underflow_error::typeinfo,std::underflow_error::~underflow_error);
  }
  *prVar1 = *prVar1 - 1;
  return;
}

Assistant:

inline void release_reference(void) const
  {
    refcount_t * refcount = refcount_addr();
    if (*refcount == 0)
      throw std::underflow_error("reference counter underflow");
    *refcount -= 1;
  }